

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O0

bool __thiscall
SharedMemoryManager::CreateShMem
          (SharedMemoryManager *this,key_t key,size_t size,bool *is_first_created)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 *in_RCX;
  size_t in_RDX;
  key_t in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string local_190 [12];
  int in_stack_fffffffffffffe7c;
  string local_170 [8];
  size_t in_stack_fffffffffffffe98;
  key_t in_stack_fffffffffffffea4;
  SharedMemoryManager *in_stack_fffffffffffffea8;
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined1 *local_28;
  
  *in_RCX = 0;
  *(key_t *)in_RDI = in_ESI;
  *(size_t *)(in_RDI + 8) = in_RDX;
  local_28 = in_RCX;
  iVar2 = shmget(in_ESI,in_RDX,0x7b6);
  *(int *)(in_RDI + 4) = iVar2;
  if (-1 < *(int *)(in_RDI + 4)) {
    *local_28 = 1;
    return true;
  }
  piVar3 = __errno_location();
  if (*piVar3 == 0x16) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"shmget error: key [ ",&local_89);
    std::__cxx11::to_string(in_stack_fffffffffffffe7c);
    std::operator+(in_stack_fffffffffffffe68,in_RDI);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,pcVar4,&local_e1);
    std::operator+(in_stack_fffffffffffffe68,in_RDI);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  else {
    piVar3 = __errno_location();
    if ((*piVar3 == 0x11) || (piVar3 = __errno_location(), *piVar3 == 0xd)) {
      bVar1 = GetShMem(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffe98
                      );
      return bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"shmget error: key [ ",&local_149);
    std::__cxx11::to_string(in_stack_fffffffffffffe7c);
    std::operator+(in_stack_fffffffffffffe68,in_RDI);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,pcVar4,(allocator *)&stack0xfffffffffffffe6f);
    std::operator+(in_stack_fffffffffffffe68,in_RDI);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  return false;
}

Assistant:

bool SharedMemoryManager::CreateShMem(key_t key, size_t size, bool* is_first_created)
{            
    *is_first_created = false;
    sh_mem_key_  = key ;
    sh_mem_size_ = size;
    sh_mem_id_ = shmget((key_t)key, size, IPC_CREAT | IPC_EXCL | 0666 ); //IPC_CREAT | IPC_EXCL 

    if (sh_mem_id_ < 0) {
        if(errno == EINVAL ) {
            err_msg_ = std::string("shmget error: key [ ") + 
                       std::to_string(key) + std::string(strerror(errno)) ;
            DEBUG_ELOG(err_msg_);
        } else if(errno == EEXIST || errno == EACCES ) {
            return GetShMem(key,size);
        } else {
            err_msg_ = std::string("shmget error: key [ ") + 
                       std::to_string(key) + std::string(strerror(errno)) ;
            DEBUG_ELOG(err_msg_);
        }
        return false;
    }
    *is_first_created = true;
    return true;
}